

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::SearchParse2CachedPCRE(int iters,char *regexp,StringPiece *text)

{
  undefined8 text_00;
  bool bVar1;
  string *__lhs;
  ostream *poVar2;
  LogMessage local_3c8;
  Arg local_248;
  Arg local_238;
  undefined1 local_228 [8];
  StringPiece sp2;
  StringPiece sp1;
  undefined1 local_200 [4];
  int i;
  undefined1 local_70 [8];
  PCRE re;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  re._72_8_ = text;
  PCRE::PCRE((PCRE *)local_70,regexp,EnabledCompileOptions);
  __lhs = PCRE::error_abi_cxx11_((PCRE *)local_70);
  bVar1 = std::operator==(__lhs,"");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x529);
    poVar2 = LogMessage::stream((LogMessage *)local_200);
    std::operator<<(poVar2,"Check failed: (re.error()) == (\"\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_200);
  }
  for (sp1._12_4_ = 0; (int)sp1._12_4_ < iters; sp1._12_4_ = sp1._12_4_ + 1) {
    StringPiece::StringPiece((StringPiece *)&sp2.length_);
    StringPiece::StringPiece((StringPiece *)local_228);
    text_00 = re._72_8_;
    PCRE::Arg::Arg(&local_238,(StringPiece *)&sp2.length_);
    PCRE::Arg::Arg(&local_248,(StringPiece *)local_228);
    bVar1 = PCRE::PartialMatchFunctor::operator()
                      ((PartialMatchFunctor *)&PCRE::PartialMatch,(StringPiece *)text_00,
                       (PCRE *)local_70,&local_238,&local_248,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                       ,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,
                       (Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args,(Arg *)PCRE::no_more_args
                      );
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_3c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x52c);
      poVar2 = LogMessage::stream(&local_3c8);
      std::operator<<(poVar2,"Check failed: PCRE::PartialMatch(text, re, &sp1, &sp2)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_3c8);
    }
  }
  PCRE::~PCRE((PCRE *)local_70);
  return;
}

Assistant:

void SearchParse2CachedPCRE(int iters, const char* regexp,
                            const StringPiece& text) {
  PCRE re(regexp, PCRE::UTF8);
  CHECK_EQ(re.error(), "");
  for (int i = 0; i < iters; i++) {
    StringPiece sp1, sp2;
    CHECK(PCRE::PartialMatch(text, re, &sp1, &sp2));
  }
}